

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

int __thiscall
kj::anon_unknown_36::PromiseNetworkAddressHttpClient::connect
          (PromiseNetworkAddressHttpClient *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  SourceLocation location;
  undefined8 uVar1;
  char *pcVar2;
  void *pvVar3;
  int __flags;
  undefined4 in_register_0000000c;
  long lVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  undefined4 in_register_00000034;
  PromiseArena *pPVar5;
  __fn *in_R8;
  __fn *__arg;
  undefined1 *in_R9;
  Event *pEVar6;
  size_t sVar7;
  SplitTuplePromise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream>_>_>_>
  split;
  undefined1 local_110 [48];
  String SStack_e0;
  undefined1 auStack_c8 [112];
  char *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined8 local_38;
  
  pEVar6 = ((Event **)CONCAT44(in_register_00000034,__fd))[4];
  if (pEVar6 == (Event *)0x0) {
    lVar4 = CONCAT44(in_register_0000000c,__len);
    __arg = in_R8;
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_110);
    __flags = (int)lVar4;
    sVar7 = CONCAT44(in_register_0000000c,__len) - 1;
    local_110._40_8_ = (Event **)CONCAT44(in_register_00000034,__fd);
    heapString(&SStack_e0,sVar7);
    pvVar3 = extraout_RDX;
    if (sVar7 != 0) {
      pPVar5 = (PromiseArena *)SStack_e0.content.size_;
      if ((PromiseArena *)SStack_e0.content.size_ != (PromiseArena *)0x0) {
        pPVar5 = (PromiseArena *)SStack_e0.content.ptr;
      }
      memcpy(pPVar5,__addr,sVar7);
      pvVar3 = extraout_RDX_00;
    }
    HttpHeaders::clone((HttpHeaders *)auStack_c8,in_R8,pvVar3,__flags,__arg);
    uVar1 = local_110._0_8_;
    auStack_c8[0x60] = *in_R9;
    auStack_c8._104_8_ = *(undefined8 *)(in_R9 + 8);
    pPVar5 = ((PromiseArenaMember *)local_110._0_8_)->arena;
    if (pPVar5 == (PromiseArena *)0x0 || (ulong)(local_110._0_8_ - (long)pPVar5) < 0xb0) {
      pvVar3 = operator_new(0x400);
      pEVar6 = (Event *)((long)pvVar3 + 0x350);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)pEVar6,(OwnPromiseNode *)local_110,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6253:11)>
                 ::anon_class_144_4_7ef71648_for_func::operator());
      *(undefined ***)((long)pvVar3 + 0x350) = &PTR_destroy_006d8c18;
      *(undefined8 *)((long)pvVar3 + 0x370) = local_110._40_8_;
      *(char **)((long)pvVar3 + 0x378) = SStack_e0.content.ptr;
      *(size_t *)((long)pvVar3 + 0x380) = SStack_e0.content.size_;
      *(ArrayDisposer **)((long)pvVar3 + 0x388) = SStack_e0.content.disposer;
      *(undefined8 *)((long)pvVar3 + 0x390) = auStack_c8._0_8_;
      *(undefined8 *)((long)pvVar3 + 0x398) = auStack_c8._8_8_;
      *(undefined8 *)((long)pvVar3 + 0x3a0) = auStack_c8._16_8_;
      *(undefined8 *)((long)pvVar3 + 0x3a8) = auStack_c8._24_8_;
      *(undefined8 *)((long)pvVar3 + 0x3b0) = auStack_c8._32_8_;
      *(undefined8 *)((long)pvVar3 + 0x3b8) = auStack_c8._40_8_;
      *(undefined8 *)((long)pvVar3 + 0x3c0) = auStack_c8._48_8_;
      *(undefined8 *)((long)pvVar3 + 0x3c8) = auStack_c8._56_8_;
      *(undefined8 *)((long)pvVar3 + 0x3d0) = auStack_c8._64_8_;
      *(undefined8 *)((long)pvVar3 + 0x3d8) = auStack_c8._72_8_;
      *(undefined8 *)((long)pvVar3 + 0x3e0) = auStack_c8._80_8_;
      *(undefined8 *)((long)pvVar3 + 1000) = auStack_c8._88_8_;
      *(undefined1 *)((long)pvVar3 + 0x3f0) = auStack_c8[0x60];
      *(undefined8 *)((long)pvVar3 + 0x3f8) = auStack_c8._104_8_;
      *(void **)((long)pvVar3 + 0x358) = pvVar3;
    }
    else {
      ((PromiseArenaMember *)local_110._0_8_)->arena = (PromiseArena *)0x0;
      pEVar6 = (Event *)(local_110._0_8_ + -0xb0);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)pEVar6,(OwnPromiseNode *)local_110,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6253:11)>
                 ::anon_class_144_4_7ef71648_for_func::operator());
      ((PromiseArenaMember *)(uVar1 + -0xb0))->_vptr_PromiseArenaMember =
           (_func_int **)&PTR_destroy_006d8c18;
      ((PromiseArenaMember *)(uVar1 + -0x90))->_vptr_PromiseArenaMember =
           (_func_int **)local_110._40_8_;
      ((PromiseArenaMember *)(uVar1 + -0x90))->arena = (PromiseArena *)SStack_e0.content.ptr;
      ((PromiseArenaMember *)(uVar1 + -0x80))->_vptr_PromiseArenaMember =
           (_func_int **)SStack_e0.content.size_;
      ((PromiseArenaMember *)(uVar1 + -0x80))->arena = (PromiseArena *)SStack_e0.content.disposer;
      ((PromiseArenaMember *)(uVar1 + -0x70))->_vptr_PromiseArenaMember =
           (_func_int **)auStack_c8._0_8_;
      ((PromiseArenaMember *)(uVar1 + -0x70))->arena = (PromiseArena *)auStack_c8._8_8_;
      ((PromiseArenaMember *)(uVar1 + -0x60))->_vptr_PromiseArenaMember =
           (_func_int **)auStack_c8._16_8_;
      ((PromiseArenaMember *)(uVar1 + -0x60))->arena = (PromiseArena *)auStack_c8._24_8_;
      ((PromiseArenaMember *)(uVar1 + -0x50))->_vptr_PromiseArenaMember =
           (_func_int **)auStack_c8._32_8_;
      ((PromiseArenaMember *)(uVar1 + -0x50))->arena = (PromiseArena *)auStack_c8._40_8_;
      ((PromiseArenaMember *)(uVar1 + -0x40))->_vptr_PromiseArenaMember =
           (_func_int **)auStack_c8._48_8_;
      ((PromiseArenaMember *)(uVar1 + -0x40))->arena = (PromiseArena *)auStack_c8._56_8_;
      ((PromiseArenaMember *)(uVar1 + -0x30))->_vptr_PromiseArenaMember =
           (_func_int **)auStack_c8._64_8_;
      ((PromiseArenaMember *)(uVar1 + -0x30))->arena = (PromiseArena *)auStack_c8._72_8_;
      ((PromiseArenaMember *)(uVar1 + -0x20))->_vptr_PromiseArenaMember =
           (_func_int **)auStack_c8._80_8_;
      ((PromiseArenaMember *)(uVar1 + -0x20))->arena = (PromiseArena *)auStack_c8._88_8_;
      *(undefined1 *)&((PromiseArenaMember *)(uVar1 + -0x10))->_vptr_PromiseArenaMember =
           auStack_c8[0x60];
      ((PromiseArenaMember *)(uVar1 + -0x10))->arena = (PromiseArena *)auStack_c8._104_8_;
      ((PromiseArenaMember *)(uVar1 + -0xb0))->arena = pPVar5;
    }
    auStack_c8._104_8_ = 0;
    auStack_c8._80_8_ = (char *)0x0;
    auStack_c8._72_8_ = (ArrayDisposer *)0x0;
    auStack_c8._64_8_ = 0;
    auStack_c8._48_8_ = (Header *)0x0;
    auStack_c8._40_8_ = (RemoveConst<kj::HttpHeaders::Header> *)0x0;
    auStack_c8._32_8_ = (ForkBranchBase *)0x0;
    auStack_c8._16_8_ = (PromiseNode *)0x0;
    auStack_c8._8_8_ = (StringPtr *)0x0;
    SStack_e0.content.size_ = 0;
    SStack_e0.content.ptr = (char *)0x0;
    local_58 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
    ;
    uStack_50 = "connect";
    local_48 = (Context *)0x140000186c;
    location.function = "connect";
    location.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
    ;
    location.lineNumber = 0x186c;
    location.columnNumber = 0x14;
    local_110._32_8_ = pEVar6;
    Promise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>_>
    ::split((Promise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>_>
             *)(local_110 + 8),location);
    uVar1 = local_110._32_8_;
    if ((Event *)local_110._32_8_ != (Event *)0x0) {
      local_110._32_8_ = (Event *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar1);
    }
    HttpHeaders::~HttpHeaders((HttpHeaders *)auStack_c8);
    sVar7 = SStack_e0.content.size_;
    pcVar2 = SStack_e0.content.ptr;
    if (SStack_e0.content.ptr != (char *)0x0) {
      SStack_e0.content.ptr = (char *)0x0;
      SStack_e0.content.size_ = 0;
      (**(SStack_e0.content.disposer)->_vptr_ArrayDisposer)
                (SStack_e0.content.disposer,pcVar2,1,sVar7,sVar7,0);
    }
    uVar1 = local_110._0_8_;
    if ((PromiseArenaMember *)local_110._0_8_ != (PromiseArenaMember *)0x0) {
      local_110._0_8_ = (PromiseArenaMember *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar1);
    }
    local_110._24_8_ = local_110._16_8_;
    (this->super_HttpClient)._vptr_HttpClient = (_func_int **)local_110._8_8_;
    local_110._8_8_ = (PromiseArenaMember *)0x0;
    local_110._16_8_ = (PromiseArenaMember *)0x0;
    newPromisedStream((kj *)&this->promise,
                      (Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)(local_110 + 0x18));
    uVar1 = local_110._24_8_;
    if ((EventLoop *)local_110._24_8_ != (EventLoop *)0x0) {
      local_110._24_8_ = (EventLoop *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar1);
    }
    uVar1 = local_110._16_8_;
    if ((PromiseArenaMember *)local_110._16_8_ != (PromiseArenaMember *)0x0) {
      local_110._16_8_ = (PromiseArenaMember *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar1);
    }
    uVar1 = local_110._8_8_;
    if ((PromiseArenaMember *)local_110._8_8_ != (PromiseArenaMember *)0x0) {
      local_110._8_8_ = (PromiseArena *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar1);
    }
  }
  else {
    local_40 = *in_R9;
    local_38 = *(undefined8 *)(in_R9 + 8);
    NetworkAddressHttpClient::connect((NetworkAddressHttpClient *)this,(int)pEVar6,__addr,__len);
  }
  return (int)this;
}

Assistant:

ConnectRequest connect(
      kj::StringPtr host, const HttpHeaders& headers, HttpConnectSettings settings) override {
    KJ_IF_SOME(c, client) {
      return c->connect(host, headers, settings);
    } else {
      auto split = promise.addBranch().then(
          [this, host=kj::str(host), headers=headers.clone(), settings]() mutable
          -> kj::Tuple<kj::Promise<ConnectRequest::Status>,
                       kj::Promise<kj::Own<kj::AsyncIoStream>>> {
        auto request = KJ_ASSERT_NONNULL(client)->connect(host, headers, kj::mv(settings));
        return kj::tuple(kj::mv(request.status), kj::mv(request.connection));
      }).split();

      return ConnectRequest {
        kj::mv(kj::get<0>(split)),
        kj::newPromisedStream(kj::mv(kj::get<1>(split)))
      };
    }